

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

void Corrade::Containers::ArrayMallocAllocator<unsigned_int>::reallocate
               (uint **array,size_t param_2,size_t newCapacity)

{
  size_t __size;
  size_t *psVar1;
  undefined8 uVar2;
  Debug *pDVar3;
  Debug aDStack_38 [40];
  
  __size = newCapacity * 4 + 8;
  psVar1 = (size_t *)realloc(*array + -2,__size);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = __size;
    *array = (uint *)(psVar1 + 1);
    return;
  }
  uVar2 = Corrade::Utility::Error::defaultOutput();
  Corrade::Utility::Error::Error((Error *)aDStack_38,uVar2,0);
  pDVar3 = (Debug *)Corrade::Utility::Debug::operator<<
                              (aDStack_38,"Containers::ArrayMallocAllocator: can\'t reallocate");
  pDVar3 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar3,__size);
  Corrade::Utility::Debug::operator<<(pDVar3,"bytes");
  Corrade::Utility::Error::~Error((Error *)aDStack_38);
  abort();
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}